

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall util_tests::test_ParseInt64::test_method(test_ParseInt64 *this)

{
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view str_09;
  string_view str_10;
  string_view str_11;
  string_view str_12;
  string_view str_13;
  string_view str_14;
  string_view str_15;
  string_view str_16;
  string_view str_17;
  string_view str_18;
  bool bVar1;
  long in_FS_OFFSET;
  int64_t n;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffff2e8;
  undefined7 in_stack_fffffffffffff2f0;
  undefined1 in_stack_fffffffffffff2f7;
  assertion_result *in_stack_fffffffffffff2f8;
  assertion_result *this_00;
  char *in_stack_fffffffffffff300;
  char *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff308;
  basic_string_view<char,_std::char_traits<char>_> *this_01;
  lazy_ostream *in_stack_fffffffffffff310;
  size_t in_stack_fffffffffffff318;
  assertion_result *line_num;
  const_string *in_stack_fffffffffffff320;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffff328;
  unit_test_log_t *this_02;
  const_string local_aa0 [2];
  lazy_ostream local_a80 [3];
  assertion_result local_a50;
  basic_string_view<char,_std::char_traits<char>_> local_a38;
  char local_a28 [16];
  const_string local_a18 [2];
  lazy_ostream local_9f8 [3];
  assertion_result local_9c8;
  unit_test_log_t local_9b0 [2];
  const_string local_9a0;
  const_string local_990 [2];
  lazy_ostream local_970 [3];
  assertion_result local_940 [2];
  const_string local_908 [2];
  lazy_ostream local_8e8 [3];
  assertion_result local_8b8 [2];
  const_string local_880 [2];
  lazy_ostream local_860 [2];
  assertion_result local_840 [2];
  const_string local_808 [2];
  lazy_ostream local_7e8 [3];
  assertion_result local_7b8 [2];
  const_string local_780 [2];
  lazy_ostream local_760 [3];
  assertion_result local_730 [2];
  const_string local_6f8 [2];
  lazy_ostream local_6d8 [3];
  assertion_result local_6a8 [2];
  const_string local_670 [2];
  lazy_ostream local_650 [3];
  assertion_result local_620 [2];
  const_string local_5e8 [2];
  lazy_ostream local_5c8 [3];
  assertion_result local_598 [2];
  const_string local_560 [2];
  lazy_ostream local_540 [3];
  assertion_result local_510 [2];
  const_string local_4d8 [2];
  lazy_ostream local_4b8 [3];
  assertion_result local_488 [2];
  const_string local_450 [2];
  lazy_ostream local_430 [3];
  assertion_result local_400 [2];
  const_string local_3c8 [2];
  lazy_ostream local_3a8 [3];
  assertion_result local_378 [2];
  const_string local_340 [2];
  lazy_ostream local_320 [3];
  assertion_result local_2f0 [2];
  const_string local_2b8 [2];
  lazy_ostream local_298 [3];
  assertion_result local_268 [2];
  const_string local_230 [2];
  lazy_ostream local_210 [3];
  assertion_result local_1e0 [2];
  const_string local_1a8 [2];
  lazy_ostream local_188 [3];
  assertion_result local_158 [2];
  const_string local_120 [2];
  lazy_ostream local_100 [3];
  assertion_result local_d0 [2];
  const_string local_98 [2];
  lazy_ostream local_78 [3];
  assertion_result local_48 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff328,in_stack_fffffffffffff320,in_stack_fffffffffffff318,
               (const_string *)in_stack_fffffffffffff310);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff308,
               in_stack_fffffffffffff300);
    str._M_str = (char *)in_stack_fffffffffffff308;
    str._M_len = (size_t)in_stack_fffffffffffff300;
    ParseInt64(str,(int64_t *)in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff2f8,(bool)in_stack_fffffffffffff2f7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    in_stack_fffffffffffff2e8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_48,local_78,local_98,0x351,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff2e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff328,in_stack_fffffffffffff320,in_stack_fffffffffffff318,
               (const_string *)in_stack_fffffffffffff310);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff308,
               in_stack_fffffffffffff300);
    str_00._M_str = (char *)in_stack_fffffffffffff308;
    str_00._M_len = (size_t)in_stack_fffffffffffff300;
    ParseInt64(str_00,(int64_t *)in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff2f8,(bool)in_stack_fffffffffffff2f7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    in_stack_fffffffffffff2e8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_d0,local_100,local_120,0x352,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff2e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff328,in_stack_fffffffffffff320,in_stack_fffffffffffff318,
               (const_string *)in_stack_fffffffffffff310);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff308,
               in_stack_fffffffffffff300);
    str_01._M_str = (char *)in_stack_fffffffffffff308;
    str_01._M_len = (size_t)in_stack_fffffffffffff300;
    ParseInt64(str_01,(int64_t *)in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff2f8,(bool)in_stack_fffffffffffff2f7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    in_stack_fffffffffffff2e8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_158,local_188,local_1a8,0x353,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff2e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff328,in_stack_fffffffffffff320,in_stack_fffffffffffff318,
               (const_string *)in_stack_fffffffffffff310);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff308,
               in_stack_fffffffffffff300);
    str_02._M_str = (char *)in_stack_fffffffffffff308;
    str_02._M_len = (size_t)in_stack_fffffffffffff300;
    ParseInt64(str_02,(int64_t *)in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff2f8,(bool)in_stack_fffffffffffff2f7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    in_stack_fffffffffffff2e8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1e0,local_210,local_230,0x354,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff2e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff328,in_stack_fffffffffffff320,in_stack_fffffffffffff318,
               (const_string *)in_stack_fffffffffffff310);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff308,
               in_stack_fffffffffffff300);
    str_03._M_str = (char *)in_stack_fffffffffffff308;
    str_03._M_len = (size_t)in_stack_fffffffffffff300;
    ParseInt64(str_03,(int64_t *)in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff2f8,(bool)in_stack_fffffffffffff2f7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    in_stack_fffffffffffff2e8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_268,local_298,local_2b8,0x355,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff2e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff328,in_stack_fffffffffffff320,in_stack_fffffffffffff318,
               (const_string *)in_stack_fffffffffffff310);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff308,
               in_stack_fffffffffffff300);
    str_04._M_str = (char *)in_stack_fffffffffffff308;
    str_04._M_len = (size_t)in_stack_fffffffffffff300;
    ParseInt64(str_04,(int64_t *)in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff2f8,(bool)in_stack_fffffffffffff2f7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    in_stack_fffffffffffff2e8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2f0,local_320,local_340,0x356,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff2e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff328,in_stack_fffffffffffff320,in_stack_fffffffffffff318,
               (const_string *)in_stack_fffffffffffff310);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff308,
               in_stack_fffffffffffff300);
    str_05._M_str = (char *)in_stack_fffffffffffff308;
    str_05._M_len = (size_t)in_stack_fffffffffffff300;
    ParseInt64(str_05,(int64_t *)in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff2f8,(bool)in_stack_fffffffffffff2f7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    in_stack_fffffffffffff2e8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_378,local_3a8,local_3c8,0x357,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff2e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff328,in_stack_fffffffffffff320,in_stack_fffffffffffff318,
               (const_string *)in_stack_fffffffffffff310);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff308,
               in_stack_fffffffffffff300);
    str_06._M_str = (char *)in_stack_fffffffffffff308;
    str_06._M_len = (size_t)in_stack_fffffffffffff300;
    ParseInt64(str_06,(int64_t *)in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff2f8,(bool)in_stack_fffffffffffff2f7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    in_stack_fffffffffffff2e8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_400,local_430,local_450,0x358,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff2e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff328,in_stack_fffffffffffff320,in_stack_fffffffffffff318,
               (const_string *)in_stack_fffffffffffff310);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff308,
               in_stack_fffffffffffff300);
    str_07._M_str = (char *)in_stack_fffffffffffff308;
    str_07._M_len = (size_t)in_stack_fffffffffffff300;
    ParseInt64(str_07,(int64_t *)in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff2f8,(bool)in_stack_fffffffffffff2f7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    in_stack_fffffffffffff2e8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_488,local_4b8,local_4d8,0x359,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff2e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff328,in_stack_fffffffffffff320,in_stack_fffffffffffff318,
               (const_string *)in_stack_fffffffffffff310);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff308,
               in_stack_fffffffffffff300);
    str_08._M_str = (char *)in_stack_fffffffffffff308;
    str_08._M_len = (size_t)in_stack_fffffffffffff300;
    ParseInt64(str_08,(int64_t *)in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff2f8,(bool)in_stack_fffffffffffff2f7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    in_stack_fffffffffffff2e8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_510,local_540,local_560,0x35b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff2e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff328,in_stack_fffffffffffff320,in_stack_fffffffffffff318,
               (const_string *)in_stack_fffffffffffff310);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff308,
               in_stack_fffffffffffff300);
    str_09._M_str = (char *)in_stack_fffffffffffff308;
    str_09._M_len = (size_t)in_stack_fffffffffffff300;
    ParseInt64(str_09,(int64_t *)in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff2f8,(bool)in_stack_fffffffffffff2f7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    in_stack_fffffffffffff2e8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_598,local_5c8,local_5e8,0x35c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff2e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff328,in_stack_fffffffffffff320,in_stack_fffffffffffff318,
               (const_string *)in_stack_fffffffffffff310);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff308,
               in_stack_fffffffffffff300);
    str_10._M_str = (char *)in_stack_fffffffffffff308;
    str_10._M_len = (size_t)in_stack_fffffffffffff300;
    ParseInt64(str_10,(int64_t *)in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff2f8,(bool)in_stack_fffffffffffff2f7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    in_stack_fffffffffffff2e8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_620,local_650,local_670,0x35d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff2e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff328,in_stack_fffffffffffff320,in_stack_fffffffffffff318,
               (const_string *)in_stack_fffffffffffff310);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff308,
               in_stack_fffffffffffff300);
    str_11._M_str = (char *)in_stack_fffffffffffff308;
    str_11._M_len = (size_t)in_stack_fffffffffffff300;
    ParseInt64(str_11,(int64_t *)in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff2f8,(bool)in_stack_fffffffffffff2f7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    in_stack_fffffffffffff2e8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_6a8,local_6d8,local_6f8,0x35e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff2e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff328,in_stack_fffffffffffff320,in_stack_fffffffffffff318,
               (const_string *)in_stack_fffffffffffff310);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff308,
               in_stack_fffffffffffff300);
    str_12._M_str = (char *)in_stack_fffffffffffff308;
    str_12._M_len = (size_t)in_stack_fffffffffffff300;
    ParseInt64(str_12,(int64_t *)in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff2f8,(bool)in_stack_fffffffffffff2f7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    in_stack_fffffffffffff2e8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_730,local_760,local_780,0x35f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff2e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff328,in_stack_fffffffffffff320,in_stack_fffffffffffff318,
               (const_string *)in_stack_fffffffffffff310);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff308,
               in_stack_fffffffffffff300);
    str_13._M_str = (char *)in_stack_fffffffffffff308;
    str_13._M_len = (size_t)in_stack_fffffffffffff300;
    ParseInt64(str_13,(int64_t *)in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff2f8,(bool)in_stack_fffffffffffff2f7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    in_stack_fffffffffffff2e8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_7b8,local_7e8,local_808,0x360,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff2e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff328,in_stack_fffffffffffff320,in_stack_fffffffffffff318,
               (const_string *)in_stack_fffffffffffff310);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff308);
    str_14._M_str = (char *)in_stack_fffffffffffff308;
    str_14._M_len = (size_t)in_stack_fffffffffffff300;
    ParseInt64(str_14,(int64_t *)in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff2f8,(bool)in_stack_fffffffffffff2f7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    in_stack_fffffffffffff2e8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_840,local_860,local_880,0x361,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff2e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff328,in_stack_fffffffffffff320,in_stack_fffffffffffff318,
               (const_string *)in_stack_fffffffffffff310);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff308,
               in_stack_fffffffffffff300);
    str_15._M_str = (char *)in_stack_fffffffffffff308;
    str_15._M_len = (size_t)in_stack_fffffffffffff300;
    ParseInt64(str_15,(int64_t *)in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff2f8,(bool)in_stack_fffffffffffff2f7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    in_stack_fffffffffffff2e8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_8b8,local_8e8,local_908,0x363,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff2e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff328,in_stack_fffffffffffff320,in_stack_fffffffffffff318,
               (const_string *)in_stack_fffffffffffff310);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff308,
               in_stack_fffffffffffff300);
    str_16._M_str = (char *)in_stack_fffffffffffff308;
    str_16._M_len = (size_t)in_stack_fffffffffffff300;
    ParseInt64(str_16,(int64_t *)in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff2f8,(bool)in_stack_fffffffffffff2f7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    in_stack_fffffffffffff2e8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_940,local_970,local_990,0x364,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff2e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    file = &local_9a0;
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    this_02 = local_9b0;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_02,file,(size_t)line_num,(const_string *)in_stack_fffffffffffff310);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff308,
               in_stack_fffffffffffff300);
    str_17._M_str = (char *)in_stack_fffffffffffff308;
    str_17._M_len = (size_t)in_stack_fffffffffffff300;
    ParseInt64(str_17,(int64_t *)in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff2f8,(bool)in_stack_fffffffffffff2f7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2f8,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    in_stack_fffffffffffff2e8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_9c8,local_9f8,local_a18,0x365,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff2e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    __str = local_a28;
    this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)boost::unit_test::(anonymous_namespace)::unit_test_log,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    this_01 = &local_a38;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_02,file,(size_t)line_num,(const_string *)in_stack_fffffffffffff310);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_01,__str);
    str_18._M_str = (char *)this_01;
    str_18._M_len = (size_t)__str;
    ParseInt64(str_18,(int64_t *)in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::assertion_result(this_00,(bool)in_stack_fffffffffffff2f7);
    in_stack_fffffffffffff310 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff2e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,
               (pointer)CONCAT17(in_stack_fffffffffffff2f7,in_stack_fffffffffffff2f0),
               (unsigned_long)in_stack_fffffffffffff2e8);
    in_stack_fffffffffffff2e8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_a50,local_a80,local_aa0,0x366,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff2e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff2e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_ParseInt64)
{
    int64_t n;
    // Valid values
    BOOST_CHECK(ParseInt64("1234", nullptr));
    BOOST_CHECK(ParseInt64("0", &n) && n == 0LL);
    BOOST_CHECK(ParseInt64("1234", &n) && n == 1234LL);
    BOOST_CHECK(ParseInt64("01234", &n) && n == 1234LL); // no octal
    BOOST_CHECK(ParseInt64("2147483647", &n) && n == 2147483647LL);
    BOOST_CHECK(ParseInt64("-2147483648", &n) && n == -2147483648LL);
    BOOST_CHECK(ParseInt64("9223372036854775807", &n) && n == int64_t{9223372036854775807});
    BOOST_CHECK(ParseInt64("-9223372036854775808", &n) && n == int64_t{-9223372036854775807-1});
    BOOST_CHECK(ParseInt64("-1234", &n) && n == -1234LL);
    // Invalid values
    BOOST_CHECK(!ParseInt64("", &n));
    BOOST_CHECK(!ParseInt64(" 1", &n)); // no padding inside
    BOOST_CHECK(!ParseInt64("1 ", &n));
    BOOST_CHECK(!ParseInt64("1a", &n));
    BOOST_CHECK(!ParseInt64("aap", &n));
    BOOST_CHECK(!ParseInt64("0x1", &n)); // no hex
    BOOST_CHECK(!ParseInt64(STRING_WITH_EMBEDDED_NULL_CHAR, &n));
    // Overflow and underflow
    BOOST_CHECK(!ParseInt64("-9223372036854775809", nullptr));
    BOOST_CHECK(!ParseInt64("9223372036854775808", nullptr));
    BOOST_CHECK(!ParseInt64("-32482348723847471234", nullptr));
    BOOST_CHECK(!ParseInt64("32482348723847471234", nullptr));
}